

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O3

void __thiscall Nes_Vrc6_Apu::save_state(Nes_Vrc6_Apu *this,vrc6_apu_state_t *out)

{
  int i;
  long lVar1;
  vrc6_apu_state_t *pvVar2;
  Nes_Vrc6_Apu *pNVar3;
  int r;
  long lVar4;
  
  out->saw_amp = (uint8_t)this->oscs[2].amp;
  lVar1 = 0;
  pvVar2 = out;
  pNVar3 = this;
  do {
    lVar4 = 0;
    do {
      pvVar2->regs[0][lVar4] = pNVar3->oscs[0].regs[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    out->delays[lVar1] = (uint16_t)this->oscs[lVar1].delay;
    out->phases[lVar1] = (uint8_t)this->oscs[lVar1].phase;
    lVar1 = lVar1 + 1;
    pNVar3 = (Nes_Vrc6_Apu *)(pNVar3->oscs + 1);
    pvVar2 = (vrc6_apu_state_t *)(pvVar2->regs + 1);
  } while (lVar1 != 3);
  return;
}

Assistant:

void Nes_Vrc6_Apu::save_state( vrc6_apu_state_t* out ) const
{
	assert( sizeof (vrc6_apu_state_t) == 20 );
	out->saw_amp = oscs [2].amp;
	for ( int i = 0; i < osc_count; i++ )
	{
		Vrc6_Osc const& osc = oscs [i];
		for ( int r = 0; r < reg_count; r++ )
			out->regs [i] [r] = osc.regs [r];
		
		out->delays [i] = osc.delay;
		out->phases [i] = osc.phase;
	}
}